

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

int STRING_quote(STRING_HANDLE handle)

{
  size_t __n;
  char *pcVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  STRING *s1;
  size_t __size;
  
  if (handle == (STRING_HANDLE)0x0) {
    iVar3 = 0x284;
  }
  else {
    pcVar1 = handle->s;
    __n = strlen(pcVar1);
    __size = 0xffffffffffffffff;
    if (__n < 0xfffffffffffffffd) {
      __size = __n + 3;
    }
    if ((__size != 0xffffffffffffffff) &&
       (pcVar1 = (char *)realloc(pcVar1,__size), pcVar1 != (char *)0x0)) {
      handle->s = pcVar1;
      memmove(pcVar1 + 1,pcVar1,__n);
      *pcVar1 = '\"';
      (pcVar1 + __n + 1)[0] = '\"';
      (pcVar1 + __n + 1)[1] = '\0';
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x291;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/strings.c"
                ,"STRING_quote",0x28f,1,"Failure reallocating value. size=%zu",__size);
    }
  }
  return iVar3;
}

Assistant:

int STRING_quote(STRING_HANDLE handle)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_STRING_07_015: [STRING_quote shall return a nonzero value if any of the supplied parameters are NULL.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        size_t s1Length = strlen(s1->s);
        size_t realloc_size = safe_add_size_t(safe_add_size_t(s1Length, 2), 1); /*2 because 2 quotes, 1 because '\0'*/
        char* temp;
        if (realloc_size == SIZE_MAX ||
            (temp = (char*)realloc(s1->s, realloc_size)) == NULL)
        {
            LogError("Failure reallocating value. size=%zu", realloc_size);
            /* Codes_SRS_STRING_07_029: [STRING_quote shall return a nonzero value if any error is encountered.] */
            result = MU_FAILURE;
        }
        else
        {
            s1->s = temp;
            memmove(s1->s + 1, s1->s, s1Length);
            s1->s[0] = '"';
            s1->s[s1Length + 1] = '"';
            s1->s[s1Length + 2] = '\0';
            result = 0;
        }
    }
    return result;
}